

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

string * __thiscall
hgdb::json::JSONWriter::escape_abi_cxx11_
          (string *__return_storage_ptr__,JSONWriter *this,string_view value)

{
  undefined8 uVar1;
  ostream *poVar2;
  char cVar3;
  JSONWriter *pJVar4;
  stringstream local_1c0 [8];
  stringstream ss;
  
  ss._384_8_ = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1c0);
  for (pJVar4 = (JSONWriter *)0x0; uVar1 = ss._384_8_, this != pJVar4;
      pJVar4 = (JSONWriter *)&(pJVar4->s_).field_0x1) {
    cVar3 = (&(pJVar4->s_).field_0x0)[value._M_len];
    poVar2 = (ostream *)&ss.field_0x8;
    if (cVar3 == '\\') {
      poVar2 = std::operator<<((ostream *)&ss.field_0x8,'\\');
      cVar3 = '\\';
    }
    std::operator<<(poVar2,cVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return (string *)uVar1;
}

Assistant:

static std::string escape(std::string_view value) {
        std::stringstream ss;
        for (auto c : value) {
            if (c == '\\') {
                ss << '\\' << '\\';
            } else {
                ss << c;
            }
        }

        return ss.str();
    }